

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uws_client.c
# Opt level: O0

int process_frame_fragment(UWS_CLIENT_INSTANCE *uws_client,size_t length,size_t needed_bytes)

{
  uchar *puVar1;
  LOGGER_LOG p_Var2;
  size_t local_48;
  LOGGER_LOG l;
  size_t realloc_size;
  uchar *new_fragment_bytes;
  int result;
  size_t needed_bytes_local;
  size_t length_local;
  UWS_CLIENT_INSTANCE *uws_client_local;
  
  if (uws_client->fragment_buffer_count < -length - 1) {
    local_48 = uws_client->fragment_buffer_count + length;
  }
  else {
    local_48 = 0xffffffffffffffff;
  }
  if ((local_48 != 0xffffffffffffffff) &&
     (puVar1 = (uchar *)realloc(uws_client->fragment_buffer,local_48), puVar1 != (uchar *)0x0)) {
    uws_client->fragment_buffer = puVar1;
    memcpy(uws_client->fragment_buffer + uws_client->fragment_buffer_count,
           uws_client->stream_buffer + (needed_bytes - length),length);
    uws_client->fragment_buffer_count = length + uws_client->fragment_buffer_count;
    return 0;
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
              ,"process_frame_fragment",0x426,1,"Cannot allocate memory for received data");
  }
  indicate_ws_error(uws_client,WS_ERROR_NOT_ENOUGH_MEMORY);
  return 0x428;
}

Assistant:

static int process_frame_fragment(UWS_CLIENT_INSTANCE *uws_client, size_t length, size_t needed_bytes)
{
    int result;
    unsigned char* new_fragment_bytes;
    size_t realloc_size = safe_add_size_t(uws_client->fragment_buffer_count, length);
    if (realloc_size == SIZE_MAX ||
        (new_fragment_bytes = (unsigned char*)realloc(uws_client->fragment_buffer, realloc_size)) == NULL)
    {
        /* Codes_SRS_UWS_CLIENT_01_379: [ If allocating memory for accumulating the bytes fails, uws shall report that the open failed by calling the on_ws_open_complete callback passed to uws_client_open_async with WS_OPEN_ERROR_NOT_ENOUGH_MEMORY. ]*/
        LogError("Cannot allocate memory for received data");
        indicate_ws_error(uws_client, WS_ERROR_NOT_ENOUGH_MEMORY);
        result = MU_FAILURE;
    }
    else
    {
        uws_client->fragment_buffer = new_fragment_bytes;
        (void)memcpy(uws_client->fragment_buffer + uws_client->fragment_buffer_count, uws_client->stream_buffer + needed_bytes - length, length);
        uws_client->fragment_buffer_count += length;
        result = 0;
    }

    return result;
}